

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall BufferReader::BufferReader(BufferReader *this,int size)

{
  int size_local;
  BufferReader *this_local;
  
  Reader::Reader((Reader *)&this->field_0x28);
  Buffer::Buffer(&this->super_Buffer,size);
  (this->super_Buffer)._vptr_Buffer = (_func_int **)0x124e48;
  *(undefined8 *)&this->field_0x28 = 0x124e80;
  this->read_end = (this->super_Buffer).buf_start;
  return;
}

Assistant:

BufferReader::BufferReader(int size) : Buffer(size) {
  read_end = buf_start;
}